

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_skip_sfx(archive_read *a)

{
  size_t local_50;
  ssize_t window;
  ssize_t bytes;
  size_t skip;
  size_t next;
  char *q;
  char *p;
  void *h;
  archive_read *a_local;
  
  local_50 = 0x1000;
  h = a;
  do {
    while (p = (char *)__archive_read_ahead((archive_read *)h,local_50,&window), p != (char *)0x0) {
      if (window < 0x16) goto LAB_0064479e;
      next = (size_t)(p + window);
      for (q = p; q + 0x16 < next; q = q + skip) {
        skip = lha_check_header_format(q);
        if (skip == 0) {
          bytes = (long)q - (long)p;
          __archive_read_consume((archive_read *)h,bytes);
          return L'\0';
        }
      }
      bytes = (long)q - (long)p;
      __archive_read_consume((archive_read *)h,bytes);
    }
    local_50 = (long)local_50 >> 1;
  } while (0x18 < local_50);
LAB_0064479e:
  archive_set_error((archive *)h,0x54,"Couldn\'t find out LHa header");
  return L'\xffffffe2';
}

Assistant:

static int
lha_skip_sfx(struct archive_read *a)
{
	const void *h;
	const char *p, *q;
	size_t next, skip;
	ssize_t bytes, window;

	window = 4096;
	for (;;) {
		h = __archive_read_ahead(a, window, &bytes);
		if (h == NULL) {
			/* Remaining bytes are less than window. */
			window >>= 1;
			if (window < (H_SIZE + 3))
				goto fatal;
			continue;
		}
		if (bytes < H_SIZE)
			goto fatal;
		p = h;
		q = p + bytes;

		/*
		 * Scan ahead until we find something that looks
		 * like the lha header.
		 */
		while (p + H_SIZE < q) {
			if ((next = lha_check_header_format(p)) == 0) {
				skip = p - (const char *)h;
				__archive_read_consume(a, skip);
				return (ARCHIVE_OK);
			}
			p += next;
		}
		skip = p - (const char *)h;
		__archive_read_consume(a, skip);
	}
fatal:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Couldn't find out LHa header");
	return (ARCHIVE_FATAL);
}